

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_examples.c
# Opt level: O3

void file_test6_should_not_be_parsed(void)

{
  char *value;
  cJSON *item;
  
  value = read_file("inputs/test6");
  if (value == (char *)0x0) {
    UnityFail("Failed to read test6 data.",0x8c);
    UnityAssertEqualNumber
              (0,global_error_0 + global_error_1,"Error pointer is incorrect.",0x91,
               UNITY_DISPLAY_STYLE_HEX64);
    return;
  }
  item = cJSON_ParseWithOpts(value,(char **)0x0,0);
  if (item != (cJSON *)0x0) {
    UnityFail("Should fail to parse what is not JSON.",0x8f);
    UnityAssertEqualNumber
              ((UNITY_INT)value,global_error_0 + global_error_1,"Error pointer is incorrect.",0x91,
               UNITY_DISPLAY_STYLE_HEX64);
    free(value);
    cJSON_Delete(item);
    return;
  }
  UnityAssertEqualNumber
            ((UNITY_INT)value,global_error_0 + global_error_1,"Error pointer is incorrect.",0x91,
             UNITY_DISPLAY_STYLE_HEX64);
  free(value);
  return;
}

Assistant:

static void file_test6_should_not_be_parsed(void)
{
    char *test6 = NULL;
    cJSON *tree = NULL;

    test6 = read_file("inputs/test6");
    TEST_ASSERT_NOT_NULL_MESSAGE(test6, "Failed to read test6 data.");

    tree = cJSON_Parse(test6);
    TEST_ASSERT_NULL_MESSAGE(tree, "Should fail to parse what is not JSON.");

    TEST_ASSERT_EQUAL_PTR_MESSAGE(test6, cJSON_GetErrorPtr(), "Error pointer is incorrect.");

    if (test6 != NULL)
    {
        free(test6);
    }
    if (tree != NULL)
    {
        cJSON_Delete(tree);
    }
}